

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::anon_unknown_0::EmitFieldNonDefaultCondition
               (Printer *printer,string *prefix,FieldDescriptor *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDescriptor FVar2;
  int iVar3;
  LogMessage *other;
  long lVar4;
  FieldDescriptor *field_00;
  char *format_00;
  bool bVar5;
  Formatter format;
  string local_98;
  undefined1 local_78 [32];
  Printer *local_58;
  undefined1 local_50 [48];
  
  FVar2 = field[1];
  if (((byte)FVar2 & 2) == 0) {
    if ((((byte)FVar2 & 0x60) == 0x20) && (*(char *)(*(long *)(field + 0x10) + 0x3a) == '\x02')) {
      if ((((byte)FVar2 & 0x10) == 0) || (*(long *)(field + 0x28) == 0)) goto LAB_002abe89;
    }
    else if (((byte)FVar2 & 0x60) == 0x40) goto LAB_002abe89;
  }
  else {
LAB_002abe89:
    if (*(char *)(*(long *)(field + 0x38) + 0x4f) == '\0') {
      internal::LogMessage::LogMessage
                ((LogMessage *)&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xdd);
      other = internal::LogMessage::operator<<
                        ((LogMessage *)&local_58,"CHECK failed: !HasHasbit(field): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_98,other);
      internal::LogMessage::~LogMessage((LogMessage *)&local_58);
    }
  }
  local_50._24_8_ = local_50 + 8;
  local_50._8_4_ = _S_red;
  local_50._16_8_ = (pointer)0x0;
  local_50._40_8_ = 0;
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  local_58 = printer;
  local_50._32_8_ = local_50._24_8_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"prefix","");
  Formatter::Set<std::__cxx11::string>((Formatter *)&local_58,&local_98,prefix);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"name","");
  FieldName_abi_cxx11_((string *)local_78,(cpp *)field,field_00);
  Formatter::Set<std::__cxx11::string>
            ((Formatter *)&local_58,&local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  if ((FieldDescriptor *)local_78._0_8_ != (FieldDescriptor *)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  FVar2 = field[1];
  if ((~(byte)FVar2 & 0x60) == 0) {
    lVar4 = *(long *)(field + 0x28);
    bVar5 = ((byte)FVar2 & 0x10) == 0;
LAB_002abfff:
    if (((bool)(lVar4 == 0 | bVar5)) ||
       ((format_00 = "if (_internal_has_$name$()) {\n", *(int *)(lVar4 + 4) == 1 &&
        ((*(byte *)(*(long *)(lVar4 + 0x20) + 1) & 2) != 0)))) {
      bVar5 = false;
      goto LAB_002ac0f8;
    }
  }
  else {
    lVar4 = *(long *)(field + 0x28);
    if (lVar4 != 0 && ((byte)FVar2 & 0x10) != 0) {
      bVar5 = false;
      goto LAB_002abfff;
    }
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_98._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_78._0_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_98,
                 (FieldDescriptor **)local_78);
    }
    iVar3 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4);
    if (iVar3 == 9) {
      format_00 = "if (!$prefix$_internal_$name$().empty()) {\n";
    }
    else {
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_98._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_78._0_8_ = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_98,
                   (FieldDescriptor **)local_78);
        iVar3 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4);
      }
      if (iVar3 == 10) {
        format_00 = "if ($prefix$_internal_has_$name$()) {\n";
      }
      else {
        if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
          local_98._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
          local_78._0_8_ = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_98,
                     (FieldDescriptor **)local_78);
          iVar3 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4);
        }
        if (iVar3 == 6) {
          format_00 = 
          "static_assert(sizeof(uint32_t) == sizeof(float), \"Code assumes uint32_t and float are the same size.\");\nfloat tmp_$name$ = $prefix$_internal_$name$();\nuint32_t raw_$name$;\nmemcpy(&raw_$name$, &tmp_$name$, sizeof(tmp_$name$));\nif (raw_$name$ != 0) {\n"
          ;
        }
        else {
          if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
            local_98._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
            local_78._0_8_ = field;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_98,
                       (FieldDescriptor **)local_78);
            iVar3 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4);
          }
          format_00 = "if ($prefix$_internal_$name$() != 0) {\n";
          if (iVar3 == 5) {
            format_00 = 
            "static_assert(sizeof(uint64_t) == sizeof(double), \"Code assumes uint64_t and double are the same size.\");\ndouble tmp_$name$ = $prefix$_internal_$name$();\nuint64_t raw_$name$;\nmemcpy(&raw_$name$, &tmp_$name$, sizeof(tmp_$name$));\nif (raw_$name$ != 0) {\n"
            ;
          }
        }
      }
    }
  }
  Formatter::operator()<>((Formatter *)&local_58,format_00);
  bVar5 = true;
  io::Printer::Indent(local_58);
LAB_002ac0f8:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_50);
  return bVar5;
}

Assistant:

bool EmitFieldNonDefaultCondition(io::Printer* printer,
                                  const std::string& prefix,
                                  const FieldDescriptor* field) {
  GOOGLE_CHECK(!HasHasbit(field));
  Formatter format(printer);
  format.Set("prefix", prefix);
  format.Set("name", FieldName(field));
  // Merge and serialize semantics: primitive fields are merged/serialized only
  // if non-zero (numeric) or non-empty (string).
  if (!field->is_repeated() && !field->containing_oneof()) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      format("if (!$prefix$_internal_$name$().empty()) {\n");
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // Message fields still have has_$name$() methods.
      format("if ($prefix$_internal_has_$name$()) {\n");
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_FLOAT) {
      format(
          "static_assert(sizeof(uint32_t) == sizeof(float), \"Code assumes "
          "uint32_t and float are the same size.\");\n"
          "float tmp_$name$ = $prefix$_internal_$name$();\n"
          "uint32_t raw_$name$;\n"
          "memcpy(&raw_$name$, &tmp_$name$, sizeof(tmp_$name$));\n"
          "if (raw_$name$ != 0) {\n");
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_DOUBLE) {
      format(
          "static_assert(sizeof(uint64_t) == sizeof(double), \"Code assumes "
          "uint64_t and double are the same size.\");\n"
          "double tmp_$name$ = $prefix$_internal_$name$();\n"
          "uint64_t raw_$name$;\n"
          "memcpy(&raw_$name$, &tmp_$name$, sizeof(tmp_$name$));\n"
          "if (raw_$name$ != 0) {\n");
    } else {
      format("if ($prefix$_internal_$name$() != 0) {\n");
    }
    format.Indent();
    return true;
  } else if (field->real_containing_oneof()) {
    format("if (_internal_has_$name$()) {\n");
    format.Indent();
    return true;
  }
  return false;
}